

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  if ((pList != (SrcList *)0x0) && (iVar2 = pList->nSrc, 0 < iVar2)) {
    piVar4 = &pList->a[0].iCursor;
    iVar3 = 0;
    do {
      if (*piVar4 < 0) {
        iVar1 = pParse->nTab;
        pParse->nTab = iVar1 + 1;
        *piVar4 = iVar1;
        if (*(Select **)(piVar4 + -6) != (Select *)0x0) {
          sqlite3SrcListAssignCursors(pParse,(*(Select **)(piVar4 + -6))->pSrc);
          iVar2 = pList->nSrc;
        }
      }
      iVar3 = iVar3 + 1;
      piVar4 = piVar4 + 0x1a;
    } while (iVar3 < iVar2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->pSelect ){
        sqlite3SrcListAssignCursors(pParse, pItem->pSelect->pSrc);
      }
    }
  }
}